

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

VarSlice * __thiscall kratos::Var::operator[](Var *this,pair<unsigned_int,_unsigned_int> slice)

{
  uint *puVar1;
  pair<unsigned_int,_unsigned_int> *ppVar2;
  pair<unsigned_int,_unsigned_int> pVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint32_t uVar9;
  VarException *pVVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::VarSlice> *s;
  pair<unsigned_int,_unsigned_int> *ppVar12;
  bool bVar13;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  Var *local_b0;
  uint local_a8;
  int local_a4;
  Var *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  pair<unsigned_int,_unsigned_int> local_90;
  undefined1 local_88 [8];
  shared_ptr<kratos::PackedSlice> packed_slice;
  undefined1 local_68 [8];
  shared_ptr<kratos::VarSlice> var_slice;
  undefined1 local_39;
  pair<unsigned_int,_unsigned_int> local_38;
  
  local_38.second = slice.second;
  uVar7 = slice.first;
  local_38 = slice;
  if (uVar7 < local_38.second) {
    pVVar10 = (VarException *)__cxa_allocate_exception(0x10);
    var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_38 & 0xffffffff);
    local_68 = (undefined1  [8])((ulong)local_38 >> 0x20);
    format_str_00.size_ = 0x22;
    format_str_00.data_ = (char *)0x25;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_68;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_88,(detail *)"low ({0}) cannot be larger than ({1})",format_str_00,
               args_00);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_a0;
    local_a0 = this;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_68,
               __l_00,(allocator_type *)&local_90);
    VarException::VarException
              (pVVar10,(string *)local_88,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_68);
    __cxa_throw(pVVar10,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar1 = (this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)(this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)puVar1 == 4) && (*puVar1 == 1)) {
    uVar6 = (*(this->super_IRNode)._vptr_IRNode[7])(this);
    if (uVar6 <= uVar7) {
      pVVar10 = (VarException *)__cxa_allocate_exception(0x10);
      uVar7 = (*(this->super_IRNode)._vptr_IRNode[7])(this);
      local_68 = (undefined1  [8])((ulong)local_38 & 0xffffffff);
      var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar7;
      format_str.size_ = 0x22;
      format_str.data_ = (char *)0x2d;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_68;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_88,(detail *)"high ({0}) has to be smaller than width ({1})",
                 format_str,args);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_a0;
      local_a0 = this;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_68
                 ,__l,(allocator_type *)&local_90);
      VarException::VarException
                (pVVar10,(string *)local_88,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_68
                );
      __cxa_throw(pVVar10,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (*puVar1 <= uVar7) {
    pVVar10 = (VarException *)__cxa_allocate_exception(0x10);
    local_68 = (undefined1  [8])((ulong)local_38 & 0xffffffff);
    var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ulong)*(this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    format_str_01.size_ = 0x22;
    format_str_01.data_ = (char *)0x2c;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_68;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_88,(detail *)"high ({0}) has to be smaller than size ({1})",
               format_str_01,args_01);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_a0;
    local_a0 = this;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_68,
               __l_01,(allocator_type *)&local_90);
    VarException::VarException
              (pVVar10,(string *)local_88,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_68);
    __cxa_throw(pVVar10,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVar2 = (pair<unsigned_int,_unsigned_int> *)
           (this->slices_).
           super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar12 = (pair<unsigned_int,_unsigned_int> *)
                 (this->slices_).
                 super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; bVar4 = ppVar12 != ppVar2, bVar4;
      ppVar12 = ppVar12 + 2) {
    cVar5 = (**(code **)(*(long *)*ppVar12 + 0x158))();
    bVar13 = true;
    if (cVar5 == '\0') {
      pVar3 = *ppVar12;
      if (local_38.first == *(uint32_t *)((long)pVar3 + 0x27c)) {
        bVar13 = local_38.second != *(uint32_t *)((long)pVar3 + 0x278);
        if (!bVar13) {
          slice = pVar3;
        }
      }
    }
    if (!bVar13) break;
  }
  if (!bVar4) {
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    local_88 = (undefined1  [8])this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::VarSlice,std::allocator<kratos::VarSlice>,kratos::Var*,unsigned_int_const&,unsigned_int_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var_slice,(VarSlice **)local_68,
               (allocator<kratos::VarSlice> *)&local_a0,(Var **)local_88,&local_38.first,
               &local_38.second);
    std::__shared_ptr<kratos::VarSlice,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<kratos::VarSlice,kratos::VarSlice>
              ((__shared_ptr<kratos::VarSlice,(__gnu_cxx::_Lock_policy)2> *)local_68,
               (VarSlice *)local_68);
    if (this->width_param_ != (Var *)0x0) {
      (**(code **)(*(long *)local_68 + 0x118))();
    }
    iVar8 = (*(this->super_IRNode)._vptr_IRNode[0x29])(this);
    cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0xb8))
                      ((long *)CONCAT44(extraout_var,iVar8));
    if ((cVar5 == '\0') ||
       (uVar9 = (**(code **)(*(long *)local_68 + 0x38))(),
       uVar9 != *(uint32_t *)((long)local_68 + 0x98))) {
      std::
      vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
      emplace_back<std::shared_ptr<kratos::VarSlice>&>
                ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                  *)&this->slices_,(shared_ptr<kratos::VarSlice> *)local_68);
    }
    else {
      iVar8 = (*(this->super_IRNode)._vptr_IRNode[0x29])(this);
      if (CONCAT44(extraout_var_00,iVar8) == 0) {
        plVar11 = (long *)0x0;
      }
      else {
        plVar11 = (long *)__dynamic_cast(CONCAT44(extraout_var_00,iVar8),&typeinfo,
                                         &PackedInterface::typeinfo,0xfffffffffffffffe);
      }
      local_90.first = local_68._0_4_;
      local_90.second = local_68._4_4_;
      iVar8 = (**(code **)(*(long *)local_68 + 0x38))();
      local_a8 = iVar8 - 1;
      local_a4 = 0;
      (**(code **)(*plVar11 + 0x10))(&local_a0,plVar11);
      local_b0 = local_a0;
      local_88._0_4_ = 0;
      local_88._4_4_ = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<kratos::PackedSlice,std::allocator<kratos::PackedSlice>,kratos::VarSlice*,unsigned_int,int,kratos::PackedStruct*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&packed_slice,
                 (PackedSlice **)local_88,(allocator<kratos::PackedSlice> *)&local_39,
                 (VarSlice **)&local_90,&local_a8,&local_a4,(PackedStruct **)&local_b0);
      std::__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<kratos::PackedSlice,kratos::PackedSlice>
                ((__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2> *)local_88,
                 (PackedSlice *)local_88);
      if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
      }
      std::
      vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
      emplace_back<std::shared_ptr<kratos::PackedSlice>&>
                ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                  *)&this->slices_,(shared_ptr<kratos::PackedSlice> *)local_88);
      std::
      vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
      emplace_back<std::shared_ptr<kratos::VarSlice>&>
                ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                  *)((long)local_88 + 0x188),(shared_ptr<kratos::VarSlice> *)local_68);
      local_68 = local_88;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var_slice,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&packed_slice);
      if (packed_slice.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   packed_slice.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
    }
    slice = (pair<unsigned_int,_unsigned_int>)local_68;
    if (var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  return (VarSlice *)slice;
}

Assistant:

VarSlice &Var::operator[](std::pair<uint32_t, uint32_t> slice) {
    auto const [high, low] = slice;
    if (low > high) {
        throw VarException(::format("low ({0}) cannot be larger than ({1})", low, high), {this});
    }
    // if the size is not 1, we are slicing off size, not width
    if (size_.size() == 1 && size_.front() == 1) {
        if (high >= width()) {
            throw VarException(
                ::format("high ({0}) has to be smaller than width ({1})", high, width()), {this});
        }
    } else {
        if (high >= size_.front()) {
            throw VarException(
                ::format("high ({0}) has to be smaller than size ({1})", high, size_.front()),
                {this});
        }
    }
    // if there is one already
    for (auto const &s : slices_) {
        if (!s->sliced_by_var()) {
            if (high == s->high && low == s->low) return *s;
        }
    }
    // create a new one
    // notice that slice is not part of generator's variables. It's handled by the parent (var)
    // itself
    std::shared_ptr<VarSlice> var_slice = ::make_shared<VarSlice>(this, high, low);
    if (width_param_) {
        var_slice->set_width_param(width_param_);
    }
    // depends on the root variable, if it is actually a struct, we need to return to the
    // actual trampoline class as proxy
    if (get_var_root_parent()->is_struct() && var_slice->width() == var_slice->var_width()) {
        // we actually reached the real struct
        auto *s = dynamic_cast<PackedInterface *>(get_var_root_parent());
        auto packed_slice = std::make_shared<PackedSlice>(var_slice.get(), var_slice->width() - 1,
                                                          0, s->packed_struct().get());
        slices_.emplace_back(packed_slice);
        // this is a hack here, but we store the parent into the child
        packed_slice->slices_.emplace_back(var_slice);
        var_slice = packed_slice;
    } else {
        slices_.emplace_back(var_slice);
    }

    return *var_slice;
}